

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuklib_integer.h
# Opt level: O0

uint32_t read32le(uint8_t *buf)

{
  uint32_t uVar1;
  uint32_t num;
  uint8_t *buf_local;
  
  uVar1 = read32ne(buf);
  return uVar1;
}

Assistant:

static inline uint32_t
read32le(const uint8_t *buf)
{
#if !defined(WORDS_BIGENDIAN) || defined(TUKLIB_FAST_UNALIGNED_ACCESS)
	uint32_t num = read32ne(buf);
	return conv32le(num);
#else
	uint32_t num = (uint32_t)buf[0];
	num |= (uint32_t)buf[1] << 8;
	num |= (uint32_t)buf[2] << 16;
	num |= (uint32_t)buf[3] << 24;
	return num;
#endif
}